

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedArgumentSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,PropertyExprSyntax **args_3,
          Token *args_4)

{
  Token name;
  Token dot;
  NamedArgumentSyntax *pNVar1;
  undefined8 *in_RCX;
  Token *in_RDX;
  Token *in_RSI;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  pNVar1 = (NamedArgumentSyntax *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  dot.info = (Info *)*in_RCX;
  dot._0_8_ = (NamedArgumentSyntax *)in_R9[1];
  name.info = (Info *)*in_R9;
  name._0_8_ = pNVar1;
  slang::syntax::NamedArgumentSyntax::NamedArgumentSyntax
            ((NamedArgumentSyntax *)in_R9[1],dot,name,*in_RDX,(PropertyExprSyntax *)*in_R9,*in_RSI);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }